

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ostream * Fixpp::details::
          FieldWriter<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>
          ::
          write<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>>
                    (ostream *os,
                    Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>
                    *field)

{
  const_iterator pIVar1;
  ostream *poVar2;
  size_t sVar3;
  Type *pTVar4;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>
  *instance;
  const_iterator __end0;
  const_iterator __begin0;
  Type *__range3;
  Type *group;
  Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>
  *field_local;
  ostream *os_local;
  
  poVar2 = (ostream *)std::ostream::operator<<(os,0x360);
  poVar2 = std::operator<<(poVar2,"=");
  sVar3 = Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>
          ::size(field);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,'|');
  pTVar4 = Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>
           ::get(field);
  pIVar1 = (const_iterator)
           (pTVar4->
           super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>_>
           ).
           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.EndX;
  for (__end0 = (const_iterator)
                (pTVar4->
                super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>_>
                ).
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>,_false>
                .
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.BeginX; __end0 != pIVar1; __end0 = __end0 + 1) {
    doWriteGroupFields<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<864u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<865u,Fixpp::Type::Int>,Fixpp::TagT<866u,Fixpp::Type::String>,Fixpp::TagT<867u,Fixpp::Type::Float>,Fixpp::TagT<868u,Fixpp::Type::String>>>,0ul,1ul,2ul,3ul>
              (os,__end0);
  }
  return os;
}

Assistant:

static std::ostream& write(std::ostream& os, const FieldT& field)
        {
            os << GroupTag::Id << "=" << field.size() << SOH;

            static constexpr size_t GroupSize = FieldT::TotalTags;

            const auto& group = field.get();
            for (const auto& instance: group)
            {
                doWriteGroupFields(os, instance, meta::seq::make_index_sequence<GroupSize>{});
            }

            return os;
        }